

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

bool __thiscall kj::Path::isWin32Special(Path *this,StringPtr part)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  char tmp [4];
  
  pcVar2 = part.content.ptr + -1;
  if ((pcVar2 == (char *)0x3) ||
     (((char *)0x3 < pcVar2 && (*(char *)((long)&(this->parts).ptr + 3) == '.')))) {
    bVar3 = false;
  }
  else if (((pcVar2 != (char *)0x4) &&
           ((pcVar2 < (char *)0x5 || (*(char *)((long)&(this->parts).ptr + 4) != '.')))) ||
          (bVar3 = true, 8 < (byte)(*(char *)((long)&(this->parts).ptr + 3) - 0x31U))) {
    return false;
  }
  tmp[3] = '\0';
  tmp._0_3_ = *(uint3 *)&(this->parts).ptr;
  lVar1 = 0;
  do {
    if ((byte)(tmp[lVar1] + 0xbfU) < 0x1a) {
      tmp[lVar1] = tmp[lVar1] | 0x20;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (bVar3) {
    bVar3 = true;
    if (tmp != (char  [4])0x6d6f63) {
      bVar3 = tmp == (char  [4])0x74706c;
    }
  }
  else {
    bVar3 = true;
    if (((tmp != (char  [4])0x6e6f63) && (tmp != (char  [4])0x6e7270)) &&
       (tmp != (char  [4])0x787561)) {
      bVar3 = tmp == (char  [4])0x6c756e;
    }
  }
  return bVar3;
}

Assistant:

inline constexpr char operator[](size_t index) const { return content[index]; }